

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::NoFieldPresenceTest_BasicMessageTest_Test::
~NoFieldPresenceTest_BasicMessageTest_Test(NoFieldPresenceTest_BasicMessageTest_Test *this)

{
  NoFieldPresenceTest_BasicMessageTest_Test *this_local;
  
  ~NoFieldPresenceTest_BasicMessageTest_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, BasicMessageTest) {
  TestAllTypes message;
  // Check default values, fill all fields, check values. We just want to
  // exercise the basic getters/setter paths here to make sure no
  // field-presence-related changes broke these.
  CheckDefaultValues(message);
  FillValues(&message);
  CheckNonDefaultValues(message);

  // Clear() should be equivalent to getting a freshly-constructed message.
  message.Clear();
  CheckDefaultValues(message);
}